

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

bool __thiscall spvtools::opt::Instruction::IsValidBasePointer(Instruction *this)

{
  Op OVar1;
  IRContext *pIVar2;
  bool bVar3;
  uint32_t uVar4;
  Instruction *pIVar5;
  uint uVar6;
  CapabilitySet *this_00;
  
  uVar4 = 0;
  if (this->has_type_id_ == true) {
    uVar4 = GetSingleWordOperand(this,0);
  }
  if (uVar4 != 0) {
    pIVar2 = this->context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    pIVar5 = analysis::DefUseManager::GetDef
                       ((pIVar2->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,uVar4);
    if (pIVar5->opcode_ == OpTypePointer) {
      pIVar2 = this->context_;
      if ((pIVar2->feature_mgr_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
          .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl ==
          (FeatureManager *)0x0) {
        IRContext::AnalyzeFeatures(pIVar2);
      }
      this_00 = &((pIVar2->feature_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                  .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl)->
                 capabilities_;
      bVar3 = EnumSet<spv::Capability>::contains(this_00,Addresses);
      if (bVar3) {
        return true;
      }
      if (this->opcode_ == OpFunctionParameter) {
        return true;
      }
      if (this->opcode_ != OpVariable) {
        uVar4 = (pIVar5->has_result_id_ & 1) + 1;
        if (pIVar5->has_type_id_ == false) {
          uVar4 = (uint)pIVar5->has_result_id_;
        }
        uVar4 = GetSingleWordOperand(pIVar5,uVar4);
        bVar3 = EnumSet<spv::Capability>::contains(this_00,CapabilityVariablePointersStorageBuffer);
        if (((bVar3) && (uVar4 == 0xc)) ||
           ((bVar3 = EnumSet<spv::Capability>::contains(this_00,CapabilityVariablePointers),
            uVar4 == 4 && (bVar3)))) {
          OVar1 = this->opcode_;
          if ((int)OVar1 < 0xa9) {
            if (OVar1 == OpConstantNull) {
              return true;
            }
            if (OVar1 == OpFunctionCall) {
              return true;
            }
          }
          else {
            if (OVar1 == OpSelect) {
              return true;
            }
            if (OVar1 == OpPhi) {
              return true;
            }
          }
        }
        uVar6 = (pIVar5->has_result_id_ & 1) + 1;
        if (pIVar5->has_type_id_ == false) {
          uVar6 = (uint)pIVar5->has_result_id_;
        }
        uVar4 = GetSingleWordOperand(pIVar5,uVar6 + 1);
        pIVar2 = this->context_;
        if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar2);
        }
        pIVar5 = analysis::DefUseManager::GetDef
                           ((pIVar2->def_use_mgr_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                            _M_head_impl,uVar4);
        bVar3 = IsOpaqueType(pIVar5);
        return bVar3;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Instruction::IsValidBasePointer() const {
  uint32_t tid = type_id();
  if (tid == 0) {
    return false;
  }

  Instruction* type = context()->get_def_use_mgr()->GetDef(tid);
  if (type->opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  auto feature_mgr = context()->get_feature_mgr();
  if (feature_mgr->HasCapability(spv::Capability::Addresses)) {
    // TODO: The rules here could be more restrictive.
    return true;
  }

  if (opcode() == spv::Op::OpVariable ||
      opcode() == spv::Op::OpFunctionParameter) {
    return true;
  }

  // With variable pointers, there are more valid base pointer objects.
  // Variable pointers implicitly declares Variable pointers storage buffer.
  spv::StorageClass storage_class =
      static_cast<spv::StorageClass>(type->GetSingleWordInOperand(0));
  if ((feature_mgr->HasCapability(
           spv::Capability::VariablePointersStorageBuffer) &&
       storage_class == spv::StorageClass::StorageBuffer) ||
      (feature_mgr->HasCapability(spv::Capability::VariablePointers) &&
       storage_class == spv::StorageClass::Workgroup)) {
    switch (opcode()) {
      case spv::Op::OpPhi:
      case spv::Op::OpSelect:
      case spv::Op::OpFunctionCall:
      case spv::Op::OpConstantNull:
        return true;
      default:
        break;
    }
  }

  uint32_t pointee_type_id = type->GetSingleWordInOperand(1);
  Instruction* pointee_type_inst =
      context()->get_def_use_mgr()->GetDef(pointee_type_id);

  if (pointee_type_inst->IsOpaqueType()) {
    return true;
  }
  return false;
}